

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::maybe_emit_array_assignment
          (CompilerMSL *this,uint32_t id_lhs,uint32_t id_rhs)

{
  size_t sVar1;
  Variant *pVVar2;
  ulong uVar3;
  StorageClass SVar4;
  StorageClass SVar5;
  SPIRType *pSVar6;
  SPIRVariable *pSVar7;
  SPIRConstant *c;
  string local_68;
  string local_48;
  
  uVar3 = (ulong)id_lhs;
  pSVar6 = Compiler::expression_type((Compiler *)this,id_rhs);
  sVar1 = (pSVar6->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    if ((uVar3 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar3].type == TypeVariable)) {
      pSVar7 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar3);
    }
    else {
      pSVar7 = (SPIRVariable *)0x0;
    }
    if (((pSVar7 == (SPIRVariable *)0x0) || (pSVar7->remapped_variable != true)) ||
       (pSVar7->statically_assigned == false)) {
      if (((pSVar7 == (SPIRVariable *)0x0) ||
          ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr[id_rhs].type != TypeConstant)) || (pSVar7->deferred_declaration != true)) {
        pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,id_lhs);
        if (pSVar7 != (SPIRVariable *)0x0) {
          CompilerGLSL::flush_variable_declaration
                    (&this->super_CompilerGLSL,(pSVar7->super_IVariant).self.id);
        }
        CompilerGLSL::to_expression_abi_cxx11_(&local_68,&this->super_CompilerGLSL,id_lhs,true);
        SVar4 = Compiler::get_expression_effective_storage_class((Compiler *)this,id_lhs);
        SVar5 = Compiler::get_expression_effective_storage_class((Compiler *)this,id_rhs);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x30])
                  (this,&local_68,(ulong)id_rhs,(ulong)SVar4,(ulong)SVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        Compiler::register_write((Compiler *)this,id_lhs);
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_68,&this->super_CompilerGLSL,id_lhs,true);
        c = Variant::get<spirv_cross::SPIRConstant>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + id_rhs);
        CompilerGLSL::constant_expression_abi_cxx11_(&local_48,&this->super_CompilerGLSL,c);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_68,(char (*) [4])0x2f7937,&local_48,
                   (char (*) [2])0x2ddbde);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
    }
  }
  return sVar1 != 0;
}

Assistant:

bool CompilerMSL::maybe_emit_array_assignment(uint32_t id_lhs, uint32_t id_rhs)
{
	// We only care about assignments of an entire array
	auto &type = expression_type(id_rhs);
	if (type.array.size() == 0)
		return false;

	auto *var = maybe_get<SPIRVariable>(id_lhs);

	// Is this a remapped, static constant? Don't do anything.
	if (var && var->remapped_variable && var->statically_assigned)
		return true;

	if (ir.ids[id_rhs].get_type() == TypeConstant && var && var->deferred_declaration)
	{
		// Special case, if we end up declaring a variable when assigning the constant array,
		// we can avoid the copy by directly assigning the constant expression.
		// This is likely necessary to be able to use a variable as a true look-up table, as it is unlikely
		// the compiler will be able to optimize the spvArrayCopy() into a constant LUT.
		// After a variable has been declared, we can no longer assign constant arrays in MSL unfortunately.
		statement(to_expression(id_lhs), " = ", constant_expression(get<SPIRConstant>(id_rhs)), ";");
		return true;
	}

	// Ensure the LHS variable has been declared
	auto *p_v_lhs = maybe_get_backing_variable(id_lhs);
	if (p_v_lhs)
		flush_variable_declaration(p_v_lhs->self);

	emit_array_copy(to_expression(id_lhs), id_rhs, get_expression_effective_storage_class(id_lhs),
	                get_expression_effective_storage_class(id_rhs));
	register_write(id_lhs);

	return true;
}